

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::SmallVector
          (SmallVector<spvc_specialization_constant,_8UL> *this)

{
  spvc_specialization_constant *psVar1;
  SmallVector<spvc_specialization_constant,_8UL> *this_local;
  
  VectorView<spvc_specialization_constant>::VectorView
            (&this->super_VectorView<spvc_specialization_constant>);
  this->buffer_capacity = 0;
  psVar1 = AlignedBuffer<spvc_specialization_constant,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<spvc_specialization_constant>).ptr = psVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}